

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

Int64Parameter * __thiscall
CoreML::Specification::SGDOptimizer::mutable_minibatchsize(SGDOptimizer *this)

{
  Int64Parameter *this_00;
  SGDOptimizer *this_local;
  
  if (this->minibatchsize_ == (Int64Parameter *)0x0) {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00);
    this->minibatchsize_ = this_00;
  }
  return this->minibatchsize_;
}

Assistant:

inline ::CoreML::Specification::Int64Parameter* SGDOptimizer::mutable_minibatchsize() {
  
  if (minibatchsize_ == NULL) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SGDOptimizer.miniBatchSize)
  return minibatchsize_;
}